

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::seeDoes(Forth *this,AAddr does)

{
  undefined1 *this_00;
  Cell CVar1;
  Char CVar2;
  Cell CVar3;
  double in_RAX;
  ulong uVar4;
  Definition *pDVar5;
  uint uVar6;
  long lVar7;
  double local_38;
  
  local_38 = in_RAX;
  CVar3 = dataSpaceAtCell(this,does);
  if (CVar3 != 4) {
    this_00 = &this->field_0x20;
    do {
      CVar3 = dataSpaceAtCell(this,does);
      if ((CVar3 == 0) ||
         (uVar4 = ((long)(this->definitions).
                         super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->definitions).
                         super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333,
         uVar4 < CVar3 || uVar4 - CVar3 == 0)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
        CVar3 = dataSpaceAtCell(this,this->VarOffsetNumericBase);
        if (CVar3 == 8) {
          uVar6 = 0x40;
        }
        else if (CVar3 == 10) {
          uVar6 = 2;
        }
        else {
          uVar6 = (uint)(CVar3 == 0x10) << 3;
        }
        lVar7 = *(long *)(*(long *)&this->field_0x20 + -0x18);
        *(uint *)(&this->field_0x38 + lVar7) =
             *(uint *)(&this->field_0x38 + lVar7) & 0xffffffb5 | uVar6;
        CVar3 = dataSpaceAtCell(this,does);
        std::ostream::operator<<((ostream *)this_00,CVar3);
        CVar1 = does + 4;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
        pDVar5 = definitionsAt(this,CVar3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,(pDVar5->name)._M_dataplus._M_p,
                   (pDVar5->name)._M_string_length);
        if (CVar3 - 5 < 2) {
LAB_00124611:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
          dataSpaceAtCell(this,does + 4);
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          CVar1 = does + 8;
        }
        else if (CVar3 == 0x12) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
          local_38 = 0.0;
          lVar7 = 0;
          do {
            CVar2 = dataSpaceAt(this,does + 4 + (int)lVar7);
            *(Char *)((long)&local_38 + lVar7) = CVar2;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 8);
          std::ostream::_M_insert<double>(local_38);
          CVar1 = does + 0xc;
        }
        else {
          CVar1 = does + 4;
          if (CVar3 == 1) goto LAB_00124611;
        }
      }
      does = CVar1;
      CVar3 = dataSpaceAtCell(this,does);
    } while (CVar3 != 4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x20," ;",2);
  return;
}

Assistant:

void seeDoes(AAddr does) {
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			while (XT(getDataCell( does )) != endOfDefinitionXt) {
				auto xt = findXt(getDataCell(does));
				if (xt)
					std_cout << " " << definitionsAt(xt).name;
				else
					std_cout << " " << SETBASE() << static_cast<SCell>(getDataCell(does));
				does+=sizeof(Cell);	
				if(xt==branchXt || xt==zbranchXt || xt==doLiteralXt ){
				 
				 std_cout << " " <<  getDataCell(does)	;
				 does+=sizeof(Cell);
				} else 
				if( xt==doFLiteralXt ){
				 std_cout << " " <<  getDataFCell(does)	;
				 does+=sizeof(FCell);
				}	
				
			}
			std_cout << " ;";
#endif
		}